

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void __thiscall
cmLocalGenerator::AppendDependencyInfoLinkerFlags
          (cmLocalGenerator *this,string *flags,cmGeneratorTarget *target,string *config,
          string *linkLanguage)

{
  pointer *this_00;
  cmMakefile *this_01;
  bool bVar1;
  uint uVar2;
  cmGlobalGenerator *pcVar3;
  string *psVar4;
  ulong uVar5;
  pointer this_02;
  cmListFileBacktrace local_288;
  undefined1 local_270 [8];
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  depFlags;
  RuleVariables linkDepsVariables;
  unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
  rulePlaceholderExpander;
  string local_d8 [32];
  string_view local_b8;
  undefined1 local_a8 [8];
  string depFile;
  string local_78;
  cmValue local_58;
  undefined1 local_50 [8];
  string depFlag;
  string *linkLanguage_local;
  string *config_local;
  cmGeneratorTarget *target_local;
  string *flags_local;
  cmLocalGenerator *this_local;
  
  depFlag.field_2._8_8_ = linkLanguage;
  pcVar3 = GetGlobalGenerator(this);
  uVar2 = (*pcVar3->_vptr_cmGlobalGenerator[0x35])();
  if (((uVar2 & 1) != 0) && (bVar1 = cmGeneratorTarget::HasLinkDependencyFile(target,config), bVar1)
     ) {
    this_01 = this->Makefile;
    cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[22]>
              (&local_78,(char (*) [7])0x104930a,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               depFlag.field_2._8_8_,(char (*) [22])"_LINKER_DEPFILE_FLAGS");
    local_58 = cmMakefile::GetDefinition(this_01,&local_78);
    psVar4 = cmValue::operator*[abi_cxx11_(&local_58);
    std::__cxx11::string::string((string *)local_50,(string *)psVar4);
    std::__cxx11::string::~string((string *)&local_78);
    uVar5 = std::__cxx11::string::empty();
    depFile.field_2._M_local_buf[8] = (uVar5 & 1) != 0;
    if (!(bool)depFile.field_2._M_local_buf[8]) {
      (*(this->super_cmOutputConverter)._vptr_cmOutputConverter[0xb])
                (&rulePlaceholderExpander,this,target,config);
      (*(this->super_cmOutputConverter)._vptr_cmOutputConverter[2])
                (local_d8,this,&rulePlaceholderExpander);
      local_b8 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_d8);
      cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                ((string *)local_a8,&this->super_cmOutputConverter,local_b8,SHELL,false);
      std::__cxx11::string::~string(local_d8);
      std::__cxx11::string::~string((string *)&rulePlaceholderExpander);
      (*(this->super_cmOutputConverter)._vptr_cmOutputConverter[6])(&linkDepsVariables.Launcher);
      this_00 = &depFlags.
                 super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      cmRulePlaceholderExpander::RuleVariables::RuleVariables((RuleVariables *)this_00);
      linkDepsVariables.Includes = (char *)std::__cxx11::string::c_str();
      this_02 = std::
                unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                ::operator->((unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                              *)&linkDepsVariables.Launcher);
      cmRulePlaceholderExpander::ExpandRuleVariables
                (this_02,&this->super_cmOutputConverter,(string *)local_50,(RuleVariables *)this_00)
      ;
      local_288.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      local_288.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      cmListFileBacktrace::cmListFileBacktrace(&local_288);
      cmExpandListWithBacktrace
                ((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_270,(string *)local_50,&local_288,No);
      cmListFileBacktrace::~cmListFileBacktrace(&local_288);
      cmGeneratorTarget::ResolveLinkerWrapper
                (target,(vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_270,(string *)depFlag.field_2._8_8_,false);
      (*(this->super_cmOutputConverter)._vptr_cmOutputConverter[8])(this,flags,local_270);
      std::
      vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_270);
      std::unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>::
      ~unique_ptr((unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                   *)&linkDepsVariables.Launcher);
      std::__cxx11::string::~string((string *)local_a8);
    }
    depFile.field_2._9_3_ = 0;
    std::__cxx11::string::~string((string *)local_50);
  }
  return;
}

Assistant:

void cmLocalGenerator::AppendDependencyInfoLinkerFlags(
  std::string& flags, cmGeneratorTarget* target, const std::string& config,
  const std::string& linkLanguage)
{
  if (!this->GetGlobalGenerator()->SupportsLinkerDependencyFile() ||
      !target->HasLinkDependencyFile(config)) {
    return;
  }

  auto depFlag = *this->Makefile->GetDefinition(
    cmStrCat("CMAKE_", linkLanguage, "_LINKER_DEPFILE_FLAGS"));
  if (depFlag.empty()) {
    return;
  }

  auto depFile = this->ConvertToOutputFormat(
    this->MaybeRelativeToWorkDir(this->GetLinkDependencyFile(target, config)),
    cmOutputConverter::SHELL);
  auto rulePlaceholderExpander = this->CreateRulePlaceholderExpander();
  cmRulePlaceholderExpander::RuleVariables linkDepsVariables;
  linkDepsVariables.DependencyFile = depFile.c_str();
  rulePlaceholderExpander->ExpandRuleVariables(this, depFlag,
                                               linkDepsVariables);
  auto depFlags = cmExpandListWithBacktrace(depFlag);
  target->ResolveLinkerWrapper(depFlags, linkLanguage);

  this->AppendFlags(flags, depFlags);
}